

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O0

char * dirname(char *__path)

{
  char *in_RSI;
  allocator<char> local_21;
  ulong local_20;
  size_t pos;
  string *path_local;
  
  pos = (size_t)in_RSI;
  path_local = (string *)__path;
  local_20 = std::__cxx11::string::rfind(in_RSI,0x119981);
  if (local_20 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__path,(string *)pos);
  }
  else if (local_20 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__path,"/",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    std::__cxx11::string::string((string *)__path,(string *)pos,0,local_20);
  }
  return __path;
}

Assistant:

string
dirname(const string& path)
{
    size_t pos = path.rfind("/");

    if(pos == std::string::npos)
        return path;
    else if(pos == 0)
        return "/";

    return string(path, 0, pos);
}